

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O1

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::TiledFace::getTile(TiledFace *this,int tile)

{
  FaceData **face;
  
  face = (this->super_TiledFaceBase)._tiles.
         super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
         ._M_impl.super__Vector_impl_data._M_start + tile;
  if (*face == (FaceData *)0x0) {
    readFaceData((this->super_TiledFaceBase)._reader,
                 (this->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[tile],
                 (FaceDataHeader)
                 (this->_fdh).
                 super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                 ._M_impl.super__Vector_impl_data._M_start[tile].data,
                 SUB42(*(undefined4 *)&(this->super_TiledFaceBase)._tileres,0),this->_levelid,face);
  }
  return &(*face)->super_PtexFaceData;
}

Assistant:

virtual PtexFaceData* getTile(int tile)
        {
            FaceData*& f = _tiles[tile];
            if (!f) readTile(tile, f);
            return f;
        }